

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixThread_NotifyParent(PaUnixThread *self)

{
  long in_RDI;
  PaError result;
  uint in_stack_fffffffffffffff0;
  PaError PVar1;
  
  PVar1 = 0;
  if (*(int *)(in_RDI + 8) == 0) {
    PaUtil_DebugPrint(
                     "Expression \'self->parentWaiting\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 479\n"
                     );
    PVar1 = -0x2702;
  }
  else {
    if (*(int *)(in_RDI + 0x10) == 0) {
      paUtilErr_ = PaUnixMutex_Lock((PaUnixMutex *)(ulong)in_stack_fffffffffffffff0);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaUnixMutex_Lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 483\n"
                         );
        return paUtilErr_;
      }
      *(undefined4 *)(in_RDI + 0x10) = 1;
    }
    *(undefined4 *)(in_RDI + 8) = 0;
    pthread_cond_signal((pthread_cond_t *)(in_RDI + 0x40));
    paUtilErr_ = PaUnixMutex_Unlock((PaUnixMutex *)CONCAT44(PVar1,in_stack_fffffffffffffff0));
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaUnixMutex_Unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/os/unix/pa_unix_util.c\', line: 488\n"
                       );
      PVar1 = paUtilErr_;
    }
    else {
      *(undefined4 *)(in_RDI + 0x10) = 0;
    }
  }
  return PVar1;
}

Assistant:

PaError PaUnixThread_NotifyParent( PaUnixThread* self )
{
    PaError result = paNoError;
    PA_UNLESS( self->parentWaiting, paInternalError );

    if( !self->locked )
    {
        PA_ENSURE( PaUnixMutex_Lock( &self->mtx ) );
        self->locked = 1;
    }
    self->parentWaiting = 0;
    pthread_cond_signal( &self->cond );
    PA_ENSURE( PaUnixMutex_Unlock( &self->mtx ) );
    self->locked = 0;

error:
    return result;
}